

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_compact.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::CompactHandler::processQuantity
          (CompactHandler *this,DecimalQuantity *quantity,MicroProps *micros,UErrorCode *status)

{
  CompactModInfo *pCVar1;
  long lVar2;
  bool bVar3;
  int32_t iVar4;
  Form plural;
  int32_t iVar5;
  UChar *text;
  long lVar6;
  long lVar7;
  UnicodeString local_70;
  
  (*this->parent->_vptr_MicroPropsGenerator[2])();
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    bVar3 = DecimalQuantity::isZero(quantity);
    if (bVar3) {
      RoundingImpl::apply(&micros->rounder,quantity,status);
      iVar4 = 0;
    }
    else {
      iVar5 = RoundingImpl::chooseMultiplierAndApply
                        (&micros->rounder,quantity,&(this->data).super_MultiplierProducer,status);
      bVar3 = DecimalQuantity::isZero(quantity);
      iVar4 = 0;
      if (!bVar3) {
        iVar4 = DecimalQuantity::getMagnitude(quantity);
      }
      iVar4 = iVar4 - iVar5;
    }
    plural = utils::getStandardPlural(this->rules,&quantity->super_IFixedDecimal);
    text = CompactData::getPattern(&this->data,iVar4,plural);
    if (text != (UChar *)0x0) {
      if (this->safe == '\0') {
        UnicodeString::UnicodeString(&local_70,text);
        PatternParser::parseToPatternInfo(&local_70,&this->unsafePatternInfo,status);
        UnicodeString::~UnicodeString(&local_70);
        MutablePatternModifier::setPatternInfo
                  ((MutablePatternModifier *)(micros->modMiddle + -1),
                   &(this->unsafePatternInfo).super_AffixPatternProvider);
      }
      else {
        lVar6 = -1;
        lVar2 = 8;
        do {
          lVar7 = lVar2;
          lVar6 = lVar6 + 1;
          if (this->precomputedModsLength <= lVar6) goto LAB_0027318e;
          pCVar1 = (this->precomputedMods).ptr;
          iVar5 = u_strcmp_63(text,*(UChar **)((long)&pCVar1->mod + lVar7));
          lVar2 = lVar7 + 0x10;
        } while (iVar5 != 0);
        ImmutablePatternModifier::applyToMicros
                  (*(ImmutablePatternModifier **)((long)&pCVar1[-1].patternString + lVar7),micros,
                   quantity);
      }
    }
LAB_0027318e:
    RoundingImpl::passThrough();
    *(ulong *)&(micros->rounder).fPrecision.field_0x1d =
         CONCAT53(local_70.fUnion._24_5_,local_70.fUnion._21_3_);
    *(undefined8 *)((long)&(micros->rounder).fPrecision.fUnion + 8) = local_70.fUnion._8_8_;
    *(ulong *)&(micros->rounder).fPrecision.fRoundingMode =
         CONCAT35(local_70.fUnion._21_3_,local_70.fUnion._16_5_);
    *(UObject *)&(micros->rounder).fPrecision =
         local_70.super_Replaceable.super_UObject._vptr_UObject;
    *(digits_t *)&(micros->rounder).fPrecision.fUnion = local_70.fUnion._0_2_;
    *(undefined2 *)((long)&(micros->rounder).fPrecision.fUnion + 2) =
         local_70.fUnion.fStackFields.fBuffer[0];
    *(undefined2 *)((long)&(micros->rounder).fPrecision.fUnion + 4) =
         local_70.fUnion.fStackFields.fBuffer[1];
    *(undefined2 *)((long)&(micros->rounder).fPrecision.fUnion + 6) =
         local_70.fUnion.fStackFields.fBuffer[2];
  }
  return;
}

Assistant:

void CompactHandler::processQuantity(DecimalQuantity &quantity, MicroProps &micros,
                                     UErrorCode &status) const {
    parent->processQuantity(quantity, micros, status);
    if (U_FAILURE(status)) { return; }

    // Treat zero as if it had magnitude 0
    int32_t magnitude;
    if (quantity.isZero()) {
        magnitude = 0;
        micros.rounder.apply(quantity, status);
    } else {
        // TODO: Revisit chooseMultiplierAndApply
        int32_t multiplier = micros.rounder.chooseMultiplierAndApply(quantity, data, status);
        magnitude = quantity.isZero() ? 0 : quantity.getMagnitude();
        magnitude -= multiplier;
    }

    StandardPlural::Form plural = utils::getStandardPlural(rules, quantity);
    const UChar *patternString = data.getPattern(magnitude, plural);
    if (patternString == nullptr) {
        // Use the default (non-compact) modifier.
        // No need to take any action.
    } else if (safe) {
        // Safe code path.
        // Java uses a hash set here for O(1) lookup.  C++ uses a linear search.
        // TODO: Benchmark this and maybe change to a binary search or hash table.
        int32_t i = 0;
        for (; i < precomputedModsLength; i++) {
            const CompactModInfo &info = precomputedMods[i];
            if (u_strcmp(patternString, info.patternString) == 0) {
                info.mod->applyToMicros(micros, quantity);
                break;
            }
        }
        // It should be guaranteed that we found the entry.
        U_ASSERT(i < precomputedModsLength);
    } else {
        // Unsafe code path.
        // Overwrite the PatternInfo in the existing modMiddle.
        // C++ Note: Use unsafePatternInfo for proper lifecycle.
        ParsedPatternInfo &patternInfo = const_cast<CompactHandler *>(this)->unsafePatternInfo;
        PatternParser::parseToPatternInfo(UnicodeString(patternString), patternInfo, status);
        static_cast<MutablePatternModifier*>(const_cast<Modifier*>(micros.modMiddle))
            ->setPatternInfo(&patternInfo);
    }

    // We already performed rounding. Do not perform it again.
    micros.rounder = RoundingImpl::passThrough();
}